

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O0

REF_STATUS ref_cloud_item(REF_CLOUD ref_cloud,REF_GLOB global,REF_INT *item)

{
  int local_2c;
  REF_INT i;
  REF_INT *item_local;
  REF_GLOB global_local;
  REF_CLOUD ref_cloud_local;
  
  *item = -1;
  local_2c = 0;
  while( true ) {
    if (ref_cloud->n <= local_2c) {
      return 5;
    }
    if (global == ref_cloud->global[local_2c]) break;
    local_2c = local_2c + 1;
  }
  *item = local_2c;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_item(REF_CLOUD ref_cloud, REF_GLOB global,
                                  REF_INT *item) {
  REF_INT i;

  *item = REF_EMPTY;

  each_ref_cloud_item(ref_cloud, i) {
    if (global == ref_cloud_global(ref_cloud, i)) {
      *item = i;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}